

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O3

amqp_rpc_reply_t *
amqp_publisher_confirm_wait
          (amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,timeval *timeout,
          amqp_publisher_confirm_t *result)

{
  uint64_t uVar1;
  int iVar2;
  amqp_frame_t frame;
  amqp_frame_t local_48;
  
  (__return_storage_ptr__->reply).decoded = (void *)0x0;
  *(undefined8 *)&__return_storage_ptr__->library_error = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)&__return_storage_ptr__->reply = 0;
  (result->payload).ack.delivery_tag = 0;
  *(undefined8 *)((long)&result->payload + 8) = 0;
  result->channel = 0;
  *(undefined2 *)&result->field_0x12 = 0;
  result->method = 0;
  iVar2 = amqp_simple_wait_frame_noblock(state,&local_48,timeout);
  if (iVar2 == 0) {
    if (((local_48.frame_type == '\x01') && (local_48.payload.method.id - 0x3c0050 < 0x29)) &&
       ((0x10000000401U >> ((ulong)(local_48.payload.method.id - 0x3c0050) & 0x3f) & 1) != 0)) {
      uVar1 = *(uint64_t *)(local_48.payload.properties.body_size + 8);
      (result->payload).ack.delivery_tag = *local_48.payload.method.decoded;
      *(uint64_t *)((long)&result->payload + 8) = uVar1;
      result->method = local_48.payload.method.id;
      result->channel = local_48.channel;
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_NORMAL;
      return __return_storage_ptr__;
    }
    amqp_put_back_frame(state,&local_48);
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -0x10;
  }
  else {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_publisher_confirm_wait(amqp_connection_state_t state,
                                             const struct timeval *timeout,
                                             amqp_publisher_confirm_t *result) {
  int res;
  amqp_frame_t frame;
  amqp_rpc_reply_t ret;

  memset(&ret, 0x0, sizeof(ret));
  memset(result, 0x0, sizeof(amqp_publisher_confirm_t));

  res = amqp_simple_wait_frame_noblock(state, &frame, timeout);

  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;
    return ret;
  } else if (AMQP_FRAME_METHOD != frame.frame_type ||
             (AMQP_BASIC_ACK_METHOD != frame.payload.method.id &&
              AMQP_BASIC_NACK_METHOD != frame.payload.method.id &&
              AMQP_BASIC_REJECT_METHOD != frame.payload.method.id)) {
    amqp_put_back_frame(state, &frame);
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = AMQP_STATUS_UNEXPECTED_STATE;
    return ret;
  }

  switch (frame.payload.method.id) {
    case AMQP_BASIC_ACK_METHOD:
      memcpy(&(result->payload.ack), frame.payload.method.decoded,
             sizeof(amqp_basic_ack_t));
      break;

    case AMQP_BASIC_NACK_METHOD:
      memcpy(&(result->payload.nack), frame.payload.method.decoded,
             sizeof(amqp_basic_nack_t));
      break;

    case AMQP_BASIC_REJECT_METHOD:
      memcpy(&(result->payload.reject), frame.payload.method.decoded,
             sizeof(amqp_basic_reject_t));
      break;

    default:
      amqp_put_back_frame(state, &frame);
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_UNSUPPORTED;
      return ret;
  }
  result->method = frame.payload.method.id;
  result->channel = frame.channel;
  ret.reply_type = AMQP_RESPONSE_NORMAL;

  return ret;
}